

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void lsr_46(void)

{
  except = '\0';
  temp1 = getbyte(pc);
  carry_f = RAM[temp1] & 1;
  result_f = RAM[temp1] >> 1;
  RAM[temp1] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void lsr_46(void) {
    CLE;
    result_f = RAM[temp1 = getbyte(pc)];
    carry_f = result_f & 1;
    result_f >>= 1;
    RAM[temp1] = result_f;
    pc++;
}